

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseGTMCoverage.cxx
# Opt level: O3

bool __thiscall cmParseGTMCoverage::LoadCoverageData(cmParseGTMCoverage *this,char *d)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  char *pcVar4;
  unsigned_long dindex;
  ulong uVar5;
  Directory dir;
  string file;
  string path;
  Directory local_b0;
  string local_a8;
  string local_88;
  cmParseGTMCoverage *local_68;
  char *local_60;
  unsigned_long local_58;
  string local_50;
  
  cmsys::Directory::Directory(&local_b0);
  local_60 = d;
  std::__cxx11::string::string((string *)&local_a8,d,(allocator *)&local_88);
  bVar1 = cmsys::Directory::Load(&local_b0,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    uVar3 = cmsys::Directory::GetNumberOfFiles(&local_b0);
    bVar1 = true;
    if (uVar3 != 0) {
      dindex = 0;
      uVar5 = 1;
      local_68 = this;
      local_58 = uVar3;
      do {
        pcVar4 = cmsys::Directory::GetFile(&local_b0,dindex);
        std::__cxx11::string::string((string *)&local_a8,pcVar4,(allocator *)&local_88);
        iVar2 = std::__cxx11::string::compare((char *)&local_a8);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_a8);
          if (iVar2 != 0) {
            bVar1 = cmsys::SystemTools::FileIsDirectory(&local_a8);
            if (!bVar1) {
              std::__cxx11::string::string((string *)&local_88,local_60,(allocator *)&local_50);
              std::__cxx11::string::append((char *)&local_88);
              std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
              cmsys::SystemTools::GetFilenameLastExtension(&local_50,&local_88);
              iVar2 = std::__cxx11::string::compare((char *)&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar2 == 0) {
                bVar1 = ReadMCovFile(local_68,local_88._M_dataplus._M_p);
                if (!bVar1) {
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != &local_88.field_2) {
                    operator_delete(local_88._M_dataplus._M_p,
                                    local_88.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                    operator_delete(local_a8._M_dataplus._M_p,
                                    local_a8.field_2._M_allocated_capacity + 1);
                  }
                  goto LAB_0028906e;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        bVar1 = uVar5 < local_58;
        dindex = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar1);
      bVar1 = true;
    }
  }
  else {
LAB_0028906e:
    bVar1 = false;
  }
  cmsys::Directory::~Directory(&local_b0);
  return bVar1;
}

Assistant:

bool cmParseGTMCoverage::LoadCoverageData(const char* d)
{
  // load all the .mcov files in the specified directory
  cmsys::Directory dir;
  if(!dir.Load(d))
    {
    return false;
    }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++)
    {
    std::string file = dir.GetFile(i);
    if(file != "." && file != ".."
       && !cmSystemTools::FileIsDirectory(file))
      {
      std::string path = d;
      path += "/";
      path += file;
      if(cmSystemTools::GetFilenameLastExtension(path) == ".mcov")
        {
        if(!this->ReadMCovFile(path.c_str()))
          {
          return false;
          }
        }
      }
    }
  return true;
}